

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void fl_trigger_clipboard_notify(int source)

{
  Clipboard_Notify *pCVar1;
  Clipboard_Notify *next;
  Clipboard_Notify *node;
  int source_local;
  
  next = clip_notify_list;
  while (next != (Clipboard_Notify *)0x0) {
    pCVar1 = next->next;
    (*next->handler)(source,next->data);
    next = pCVar1;
  }
  return;
}

Assistant:

void fl_trigger_clipboard_notify(int source) {
  struct Clipboard_Notify *node, *next;

  node = clip_notify_list;
  while (node != NULL) {
    next = node->next;
    node->handler(source, node->data);
    node = next;
  }
}